

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

void __thiscall Utf8Decode_OverlongAscii_Test::TestBody(Utf8Decode_OverlongAscii_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  allocator<unsigned_char> local_10d;
  uchar local_10c [4];
  iterator local_108;
  size_type local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  cpstring local_e0;
  allocator<unsigned_char> local_bc;
  uchar local_bb [3];
  iterator local_b8;
  size_type local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  cpstring local_90;
  allocator<unsigned_char> local_5b;
  uchar local_5a [2];
  iterator local_58;
  size_type local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  cpstring local_30;
  Utf8Decode_OverlongAscii_Test *local_10;
  Utf8Decode_OverlongAscii_Test *this_local;
  
  local_5a[0] = 0xc0;
  local_5a[1] = 0xaf;
  local_58 = local_5a;
  local_50 = 2;
  local_10 = this;
  std::allocator<unsigned_char>::allocator(&local_5b);
  __l_01._M_len = local_50;
  __l_01._M_array = local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_48,__l_01,&local_5b);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_30,this,&local_48);
  std::__cxx11::u32string::~u32string((u32string *)&local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_48);
  std::allocator<unsigned_char>::~allocator(&local_5b);
  local_bb[0] = 0xe0;
  local_bb[1] = 0x80;
  local_bb[2] = 0xaf;
  local_b8 = local_bb;
  local_b0 = 3;
  std::allocator<unsigned_char>::allocator(&local_bc);
  __l_00._M_len = local_b0;
  __l_00._M_array = local_b8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_a8,__l_00,&local_bc);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_90,this,&local_a8);
  std::__cxx11::u32string::~u32string((u32string *)&local_90);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_a8);
  std::allocator<unsigned_char>::~allocator(&local_bc);
  builtin_memcpy(local_10c,"/",4);
  local_108 = local_10c;
  local_100 = 4;
  std::allocator<unsigned_char>::allocator(&local_10d);
  __l._M_len = local_100;
  __l._M_array = local_108;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_f8,__l,&local_10d);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_e0,this,&local_f8);
  std::__cxx11::u32string::~u32string((u32string *)&local_e0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_f8);
  std::allocator<unsigned_char>::~allocator(&local_10d);
  return;
}

Assistant:

TEST_F (Utf8Decode, OverlongAscii) {
    decode_bad (bytes ({0xC0, 0xAF}));             // U+002F
    decode_bad (bytes ({0xE0, 0x80, 0xAF}));       // U+002F
    decode_bad (bytes ({0xF0, 0x80, 0x80, 0xAF})); // U+002F
}